

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O2

void __thiscall VectorDouble::storeValue(VectorDouble *this,double v,unsigned_long l)

{
  ulong uVar1;
  double *__ptr;
  long lVar2;
  
  __ptr = this->vData;
  uVar1 = this->vaLength;
  if (uVar1 <= l) {
    lVar2 = (l + 1) - uVar1;
    if (lVar2 < vDefaultBoost) {
      lVar2 = vDefaultBoost;
    }
    this->vaLength = lVar2 + uVar1;
    __ptr = (double *)realloc(__ptr,(lVar2 + uVar1) * 8);
    this->vData = __ptr;
    this->vLength = l + 1;
  }
  __ptr[l] = v;
  return;
}

Assistant:

void VectorDouble::storeValue(const double v, const unsigned long l) {
  long addThis;
  if (l >= vaLength) {
    addThis = l - vaLength + 1;
    if (VectorDouble::vDefaultBoost > addThis)
      addThis = VectorDouble::vDefaultBoost;
    vaLength += addThis;
    vData = (double *)realloc(vData, sizeof(double) * vaLength);
    vLength = l + 1;
  }
  vData[l] = v;
}